

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O0

int add_string(CONF *conf,CONF_SECTION *section,CONF_VALUE *value)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  CONF_VALUE *local_30;
  CONF_VALUE *old_value;
  CONF_VALUE *value_local;
  CONF_SECTION *section_local;
  CONF *conf_local;
  
  old_value = value;
  value_local = (CONF_VALUE *)section;
  section_local = (CONF_SECTION *)conf;
  pcVar2 = OPENSSL_strdup(section->name);
  old_value->section = pcVar2;
  if (old_value->section == (char *)0x0) {
    conf_local._4_4_ = 0;
  }
  else {
    sVar3 = sk_CONF_VALUE_push((stack_st_CONF_VALUE *)value_local->name,old_value);
    if (sVar3 == 0) {
      conf_local._4_4_ = 0;
    }
    else {
      iVar1 = lh_CONF_VALUE_insert((lhash_st_CONF_VALUE *)section_local->name,&local_30,old_value);
      if (iVar1 == 0) {
        sk_CONF_VALUE_pop((stack_st_CONF_VALUE *)value_local->name);
        conf_local._4_4_ = 0;
      }
      else {
        if (local_30 != (CONF_VALUE *)0x0) {
          sk_CONF_VALUE_delete_ptr((stack_st_CONF_VALUE *)value_local->name,local_30);
          value_free(local_30);
        }
        conf_local._4_4_ = 1;
      }
    }
  }
  return conf_local._4_4_;
}

Assistant:

static int add_string(const CONF *conf, CONF_SECTION *section,
                      CONF_VALUE *value) {
  value->section = OPENSSL_strdup(section->name);
  if (value->section == NULL) {
    return 0;
  }

  if (!sk_CONF_VALUE_push(section->values, value)) {
    return 0;
  }

  CONF_VALUE *old_value;
  if (!lh_CONF_VALUE_insert(conf->values, &old_value, value)) {
    // Remove |value| from |section->values|, so we do not leave a dangling
    // pointer.
    sk_CONF_VALUE_pop(section->values);
    return 0;
  }
  if (old_value != NULL) {
    (void)sk_CONF_VALUE_delete_ptr(section->values, old_value);
    value_free(old_value);
  }

  return 1;
}